

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O1

int LiteScript::Syntax::ReadControlFor
              (char *text,
              vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl,
              ErrorType *errorType)

{
  pointer pIVar1;
  pointer pIVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ErrorType *in_RCX;
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *pvVar9;
  uint i;
  long lVar10;
  uint i_5;
  ulong uVar11;
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *pvVar12;
  uint i_6;
  string keyword;
  allocator local_99;
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *local_98;
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  ulong local_68;
  ulong local_60;
  ulong local_58;
  string local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  uVar3 = ReadName(text,&local_50);
  iVar7 = 0;
  if ((uVar3 == 0) ||
     (iVar4 = std::__cxx11::string::compare((char *)&local_50), iVar7 = 0, iVar4 != 0))
  goto LAB_0013a667;
  uVar3 = 0;
  local_98 = (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)errorType;
  while( true ) {
    while( true ) {
      if ((0x20 < (ulong)(byte)text[(ulong)uVar3 + 3]) ||
         ((0x100000600U >> ((ulong)(byte)text[(ulong)uVar3 + 3] & 0x3f) & 1) == 0)) break;
      uVar3 = uVar3 + 1;
    }
    uVar5 = ReadComment(text + (ulong)uVar3 + 3);
    if (uVar5 == 0) break;
    uVar3 = uVar3 + uVar5;
  }
  if (text[(long)(int)uVar3 + 3] != '(') {
    *(undefined4 *)
     &(local_98->
      super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>)._M_impl
      .super__Vector_impl_data._M_start = 0x17;
    iVar7 = -3;
    goto LAB_0013a500;
  }
  lVar10 = (long)(int)uVar3 + 4;
  uVar5 = 0;
  local_90 = instrl;
  while( true ) {
    while( true ) {
      if ((0x20 < (ulong)(byte)text[(ulong)uVar5 + lVar10]) ||
         ((0x100000600U >> ((ulong)(byte)text[(ulong)uVar5 + lVar10] & 0x3f) & 1) == 0)) break;
      uVar5 = uVar5 + 1;
    }
    uVar6 = ReadComment(text + (ulong)uVar5 + lVar10);
    if (uVar6 == 0) break;
    uVar5 = uVar5 + uVar6;
  }
  uVar3 = uVar5 + uVar3 + 4;
  if (text[(int)uVar3] == ';') {
LAB_0013a578:
    uVar5 = 0;
    while( true ) {
      while( true ) {
        if ((0x20 < (ulong)(byte)text[(ulong)uVar5 + (long)(int)uVar3 + 1]) ||
           ((0x100000600U >> ((ulong)(byte)text[(ulong)uVar5 + (long)(int)uVar3 + 1] & 0x3f) & 1) ==
            0)) break;
        uVar5 = uVar5 + 1;
      }
      uVar6 = ReadComment(text + (ulong)uVar5 + (long)(int)uVar3 + 1);
      if (uVar6 == 0) break;
      uVar5 = uVar5 + uVar6;
    }
    uVar3 = uVar5 + uVar3 + 1;
    pIVar1 = (local_90->
             super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    pIVar2 = (local_90->
             super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
             _M_impl.super__Vector_impl_data._M_start;
    iVar7 = ReadExpression((Syntax *)(text + (int)uVar3),(char *)local_90,local_98,in_RCX);
    if (iVar7 < 1) {
      if (iVar7 != 0) {
LAB_0013a500:
        iVar7 = iVar7 - uVar3;
        goto LAB_0013a667;
      }
      *(undefined4 *)
       &(local_98->
        super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
        _M_impl.super__Vector_impl_data._M_start = 0x10;
    }
    else {
      local_58 = (ulong)((long)pIVar1 - (long)pIVar2) >> 4;
      iVar7 = iVar7 + uVar3;
      uVar3 = 0;
      while( true ) {
        while( true ) {
          if ((0x20 < (ulong)(byte)text[(ulong)uVar3 + (long)iVar7]) ||
             ((0x100000600U >> ((ulong)(byte)text[(ulong)uVar3 + (long)iVar7] & 0x3f) & 1) == 0))
          break;
          uVar3 = uVar3 + 1;
        }
        uVar5 = ReadComment(text + (ulong)uVar3 + (long)iVar7);
        if (uVar5 == 0) break;
        uVar3 = uVar3 + uVar5;
      }
      uVar3 = uVar3 + iVar7;
      if (text[(int)uVar3] != ';') goto LAB_0013a657;
      lVar10 = (long)(int)uVar3 + 1;
      uVar11 = 0;
      while( true ) {
        while( true ) {
          iVar7 = (int)uVar11;
          if ((0x20 < (ulong)(byte)text[uVar11 + lVar10]) ||
             ((0x100000600U >> ((ulong)(byte)text[uVar11 + lVar10] & 0x3f) & 1) == 0)) break;
          uVar11 = (ulong)(iVar7 + 1);
        }
        uVar5 = ReadComment(text + uVar11 + lVar10);
        pvVar12 = local_90;
        if (uVar5 == 0) break;
        uVar11 = (ulong)(iVar7 + uVar5);
      }
      local_68 = (long)(local_90->
                       super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_90->
                       super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                       )._M_impl.super__Vector_impl_data._M_start;
      Instruction::Instruction((Instruction *)local_88,INSTR_JUMP_ELSE);
      std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
      emplace_back<LiteScript::Instruction>(pvVar12,(Instruction *)local_88);
      Instruction::~Instruction((Instruction *)local_88);
      Instruction::Instruction((Instruction *)local_88,INSTR_JUMP_TO);
      pvVar12 = local_90;
      std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
      emplace_back<LiteScript::Instruction>(local_90,(Instruction *)local_88);
      iVar7 = iVar7 + uVar3 + 1;
      Instruction::~Instruction((Instruction *)local_88);
      iVar4 = ReadExpression((Syntax *)(text + iVar7),(char *)pvVar12,local_98,in_RCX);
      if (iVar4 < 1) {
        if (iVar4 < 0) {
          iVar7 = iVar4 - iVar7;
          goto LAB_0013a667;
        }
      }
      else {
        Instruction::Instruction((Instruction *)local_88,INSTR_VALUE_POP);
        std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
        emplace_back<LiteScript::Instruction>(local_90,(Instruction *)local_88);
        iVar7 = iVar7 + iVar4;
        Instruction::~Instruction((Instruction *)local_88);
      }
      local_60 = local_68 >> 4;
      uVar3 = 0;
      while( true ) {
        while( true ) {
          if ((0x20 < (ulong)(byte)text[(ulong)uVar3 + (long)iVar7]) ||
             ((0x100000600U >> ((ulong)(byte)text[(ulong)uVar3 + (long)iVar7] & 0x3f) & 1) == 0))
          break;
          uVar3 = uVar3 + 1;
        }
        uVar5 = ReadComment(text + (ulong)uVar3 + (long)iVar7);
        if (uVar5 == 0) break;
        uVar3 = uVar3 + uVar5;
      }
      Instruction::Instruction((Instruction *)local_88,INSTR_JUMP_TO,(int)local_58);
      pvVar12 = local_90;
      std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
      emplace_back<LiteScript::Instruction>(local_90,(Instruction *)local_88);
      Instruction::~Instruction((Instruction *)local_88);
      Instruction::Instruction
                ((Instruction *)local_88,INSTR_JUMP_TO,
                 (int)((ulong)((long)(pvVar12->
                                     super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar12->
                                    super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 4));
      local_68 = local_68 * 0x10000000;
      Instruction::operator=
                ((Instruction *)
                 (&((pvVar12->
                    super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                    )._M_impl.super__Vector_impl_data._M_start)->code +
                 ((long)(local_68 + 0x100000000) >> 0x1c)),(Instruction *)local_88);
      iVar7 = uVar3 + iVar7;
      Instruction::~Instruction((Instruction *)local_88);
      if (text[iVar7] != ')') {
        *(undefined4 *)
         &(local_98->
          super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
          _M_impl.super__Vector_impl_data._M_start = 0x18;
        iVar7 = -iVar7;
        goto LAB_0013a667;
      }
      lVar10 = (long)iVar7 + 1;
      uVar3 = 0;
      while( true ) {
        while( true ) {
          if ((0x20 < (ulong)(byte)text[(ulong)uVar3 + lVar10]) ||
             ((0x100000600U >> ((ulong)(byte)text[(ulong)uVar3 + lVar10] & 0x3f) & 1) == 0)) break;
          uVar3 = uVar3 + 1;
        }
        uVar5 = ReadComment(text + (ulong)uVar3 + lVar10);
        pvVar12 = local_90;
        if (uVar5 == 0) break;
        uVar3 = uVar3 + uVar5;
      }
      uVar3 = uVar3 + iVar7 + 1;
      pIVar1 = (local_90->
               super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pIVar2 = (local_90->
               super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
               )._M_impl.super__Vector_impl_data._M_start;
      iVar7 = ReadInstruction(text + (int)uVar3,local_90,(ErrorType *)local_98);
      if (0 < iVar7) {
        uVar5 = (int)local_60 + 2;
        local_60 = (ulong)uVar5;
        Instruction::Instruction((Instruction *)local_88,INSTR_JUMP_TO,uVar5);
        std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
        emplace_back<LiteScript::Instruction>(pvVar12,(Instruction *)local_88);
        Instruction::~Instruction((Instruction *)local_88);
        Instruction::Instruction
                  ((Instruction *)local_88,INSTR_JUMP_ELSE,
                   (int)((ulong)((long)(pvVar12->
                                       super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pvVar12->
                                      super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 4));
        Instruction::operator=
                  ((Instruction *)
                   (&((pvVar12->
                      super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                      )._M_impl.super__Vector_impl_data._M_start)->code + ((long)local_68 >> 0x1c)),
                   (Instruction *)local_88);
        iVar7 = iVar7 + uVar3;
        Instruction::~Instruction((Instruction *)local_88);
        pvVar9 = (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)
                 ((ulong)((long)(pvVar12->
                                super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar12->
                               super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 4);
        iVar4 = (int)pvVar9;
        uVar3 = (uint)((ulong)((long)pIVar1 - (long)pIVar2) >> 4);
        if ((int)uVar3 < iVar4 + -1) {
          lVar10 = (long)(int)uVar3 << 4;
          iVar4 = ~uVar3 + iVar4;
          local_98 = pvVar9;
          do {
            pIVar1 = (pvVar12->
                     super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if (((&pIVar1->code)[lVar10] == ';') && ((&pIVar1->comp_type)[lVar10] == '\x04')) {
              std::__cxx11::string::string
                        ((string *)local_88,*(char **)((long)&pIVar1->comp_value + lVar10),&local_99
                        );
              iVar8 = std::__cxx11::string::compare((char *)local_88);
              if (local_88[0] != local_78) {
                operator_delete(local_88[0]);
              }
              if (iVar8 == 0) {
                Instruction::Instruction((Instruction *)local_88,INSTR_JUMP_TO,(int)local_98);
                pvVar12 = local_90;
                Instruction::operator=
                          ((Instruction *)
                           (&((local_90->
                              super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                              )._M_impl.super__Vector_impl_data._M_start)->code + lVar10),
                           (Instruction *)local_88);
              }
              else {
                std::__cxx11::string::string
                          ((string *)local_88,
                           *(char **)((long)&((local_90->
                                              super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                              )._M_impl.super__Vector_impl_data._M_start)->
                                             comp_value + lVar10),&local_99);
                iVar8 = std::__cxx11::string::compare((char *)local_88);
                if (local_88[0] != local_78) {
                  operator_delete(local_88[0]);
                }
                pvVar12 = local_90;
                if (iVar8 != 0) goto LAB_0013aa7b;
                Instruction::Instruction((Instruction *)local_88,INSTR_JUMP_TO,(int)local_60);
                Instruction::operator=
                          ((Instruction *)
                           (&((pvVar12->
                              super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                              )._M_impl.super__Vector_impl_data._M_start)->code + lVar10),
                           (Instruction *)local_88);
              }
              Instruction::~Instruction((Instruction *)local_88);
            }
LAB_0013aa7b:
            lVar10 = lVar10 + 0x10;
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
        goto LAB_0013a667;
      }
      if (iVar7 != 0) goto LAB_0013a500;
      *(undefined4 *)
       &(local_98->
        super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
        _M_impl.super__Vector_impl_data._M_start = 0x1e;
    }
  }
  else {
    iVar7 = ReadVariableDefinition(text + (int)uVar3,local_90,(ErrorType *)local_98);
    if (iVar7 < 1) {
      if (iVar7 < 0) goto LAB_0013a500;
      iVar7 = ReadExpression((Syntax *)(text + (int)uVar3),(char *)local_90,local_98,in_RCX);
      if (0 < iVar7) {
        Instruction::Instruction((Instruction *)local_88,INSTR_VALUE_POP);
        std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
        emplace_back<LiteScript::Instruction>(local_90,(Instruction *)local_88);
        Instruction::~Instruction((Instruction *)local_88);
        goto LAB_0013a535;
      }
      if (iVar7 < 0) goto LAB_0013a500;
      *(undefined4 *)
       &(local_98->
        super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
        _M_impl.super__Vector_impl_data._M_start = 0xf;
    }
    else {
LAB_0013a535:
      iVar7 = iVar7 + uVar3;
      uVar3 = 0;
      while( true ) {
        while( true ) {
          if ((0x20 < (ulong)(byte)text[(ulong)uVar3 + (long)iVar7]) ||
             ((0x100000600U >> ((ulong)(byte)text[(ulong)uVar3 + (long)iVar7] & 0x3f) & 1) == 0))
          break;
          uVar3 = uVar3 + 1;
        }
        uVar5 = ReadComment(text + (ulong)uVar3 + (long)iVar7);
        if (uVar5 == 0) break;
        uVar3 = uVar3 + uVar5;
      }
      uVar3 = uVar3 + iVar7;
      if (text[(int)uVar3] == ';') goto LAB_0013a578;
LAB_0013a657:
      *(undefined4 *)
       &(local_98->
        super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
        _M_impl.super__Vector_impl_data._M_start = 0x1d;
    }
  }
  iVar7 = -uVar3;
LAB_0013a667:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return iVar7;
}

Assistant:

int LiteScript::Syntax::ReadControlFor(const char *text, std::vector<Instruction> &instrl,
                                         Script::ErrorType &errorType) {
    std::string keyword;
    if (ReadName(text, keyword) == 0 || keyword != "for")
        return 0;
    int i = 3, tmp;
    i += (int)ReadWhitespace(text + i);
    if (text[i] != '(') {
        errorType = Script::ErrorType::SCRPT_ERROR_PARENTHESIS_OPEN;
        return -i;
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    if (text[i] != ';') {
        if ((tmp = ReadVariableDefinition(text + i, instrl, errorType)) > 0)
            i += tmp;
        else if (tmp < 0)
            return tmp - i;
        else if ((tmp = ReadExpression(text + i, instrl, errorType)) > 0) {
            i += tmp;
            instrl.push_back(Instruction(InstrCode::INSTR_VALUE_POP));
        }
        else if (tmp < 0)
            return tmp - i;
        else {
            errorType = Script::ErrorType::SCRPT_ERROR_FOR_INITIALISATION;
            return -i;
        }
        i += (int)ReadWhitespace(text + i);
        if (text[i] != ';') {
            errorType = Script::ErrorType::SCRPT_ERROR_SEMICOLON;
            return -i;
        }
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    int jc = instrl.size();
    if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
        if (tmp != 0)
            return tmp - i;
        else {
            errorType = Script::ErrorType::SCRPT_ERROR_FOR_CONDITION;
            return -i;
        }
    }
    i += tmp;
    i += (int)ReadWhitespace(text + i);
    if (text[i] != ';') {
        errorType = Script::ErrorType::SCRPT_ERROR_SEMICOLON;
        return -i;
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    int jb = instrl.size();
    instrl.push_back(Instruction(InstrCode::INSTR_JUMP_ELSE));
    instrl.push_back(Instruction(InstrCode::INSTR_JUMP_TO));
    if ((tmp = ReadExpression(text + i, instrl, errorType)) > 0) {
        i += tmp;
        instrl.push_back(Instruction(InstrCode::INSTR_VALUE_POP));
    }
    else if (tmp < 0)
        return tmp - i;
    i += (int)ReadWhitespace(text + i);
    instrl.push_back(Instruction(InstrCode::INSTR_JUMP_TO, jc));
    instrl[jb + 1] = Instruction(InstrCode::INSTR_JUMP_TO, (int)instrl.size());
    if (text[i] != ')') {
        errorType = Script::ErrorType::SCRPT_ERROR_PARENTHESIS_CLOSE;
        return -i;
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    int jex = instrl.size();
    if ((tmp = ReadInstruction(text + i, instrl, errorType)) <= 0) {
        if (tmp != 0)
            return tmp - i;
        else {
            errorType = Script::ErrorType::SCRPT_ERROR_INSTRUCTION;
            return -i;
        }
    }
    i += tmp;
    instrl.push_back(Instruction(InstrCode::INSTR_JUMP_TO, jb + 2));
    instrl[jb] = Instruction(InstrCode::INSTR_JUMP_ELSE, (int)instrl.size());
    for (int it = jex, sz = instrl.size() - 1; it < sz; it++) {
        if (instrl[it].code == InstrCode::INSTR_JUMP_TO &&
            instrl[it].comp_type == Instruction::CompType::COMP_TYPE_STRING) {
            if (std::string(instrl[it].comp_value.v_string) == "break")
                instrl[it] = Instruction(InstrCode::INSTR_JUMP_TO, sz + 1);
            else if (std::string(instrl[it].comp_value.v_string) == "continue")
                instrl[it] = Instruction(InstrCode::INSTR_JUMP_TO, jb + 2);
        }
    }
    return i;
}